

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O3

char * searchForTZFile(char *path,DefaultTZInfo *tzInfo)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DIR *pDVar4;
  CharString *pCVar5;
  dirent *pdVar6;
  DIR *__dirp;
  char *pcVar7;
  FILE *pFVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  size_t __n;
  char *s;
  ulong uVar12;
  UErrorCode status;
  CharString newpath;
  CharString curpath;
  char *zoneid;
  UErrorCode local_2cc;
  FILE *local_2c8;
  DIR *local_2c0;
  CharString local_2b8;
  CharString local_278;
  char *local_238 [65];
  
  local_2cc = U_ZERO_ERROR;
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_278.buffer);
  local_278.len = 0;
  *local_278.buffer.ptr = '\0';
  pcVar7 = path;
  icu_63::CharString::append(&local_278,path,-1,&local_2cc);
  if ((U_ZERO_ERROR < local_2cc) || (pDVar4 = opendir(path), pDVar4 == (DIR *)0x0)) {
    pcVar7 = (char *)0x0;
    goto LAB_0029b6a4;
  }
  if (gSearchTZFileResult == (CharString *)0x0) {
    pCVar5 = (CharString *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar7);
    if (pCVar5 != (CharString *)0x0) {
      icu_63::MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)pCVar5);
      pCVar5->len = 0;
      *(pCVar5->buffer).ptr = '\0';
      gSearchTZFileResult = pCVar5;
      ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
      goto LAB_0029b3a5;
    }
    gSearchTZFileResult = (CharString *)0x0;
    pcVar7 = (char *)0x0;
  }
  else {
LAB_0029b3a5:
    do {
      do {
        pcVar7 = (char *)0x0;
        pdVar6 = readdir(pDVar4);
        if (pdVar6 == (dirent *)0x0) goto LAB_0029b69c;
      } while ((pdVar6->d_name[0] == '.') &&
              ((pdVar6->d_name[1] == '\0' ||
               ((pdVar6->d_name[1] == '.' && (pdVar6->d_name[2] == '\0'))))));
      icu_63::CharString::CharString(&local_2b8,&local_278,&local_2cc);
      s = pdVar6->d_name;
      icu_63::CharString::append(&local_2b8,s,-1,&local_2cc);
      if (U_ZERO_ERROR < local_2cc) {
LAB_0029b692:
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_2b8.buffer);
        break;
      }
      __dirp = opendir(local_2b8.buffer.ptr);
      if (__dirp == (DIR *)0x0) {
        iVar2 = strcmp("posixrules",s);
        if ((iVar2 != 0) &&
           (iVar2 = strcmp("localtime",s), pcVar7 = local_2b8.buffer.ptr, iVar2 != 0)) {
          if (tzInfo->defaultTZFilePtr == (FILE *)0x0) {
            pFVar8 = fopen("/etc/localtime","r");
            tzInfo->defaultTZFilePtr = (FILE *)pFVar8;
          }
          local_2c8 = fopen(pcVar7,"r");
          tzInfo->defaultTZPosition = 0;
          if (local_2c8 != (FILE *)0x0) {
            local_2c0 = pDVar4;
            if ((FILE *)tzInfo->defaultTZFilePtr != (FILE *)0x0) {
              if (tzInfo->defaultTZFileSize == 0) {
                fseek((FILE *)tzInfo->defaultTZFilePtr,0,2);
                lVar9 = ftell((FILE *)tzInfo->defaultTZFilePtr);
                tzInfo->defaultTZFileSize = lVar9;
              }
              pFVar8 = local_2c8;
              fseek(local_2c8,0,2);
              uVar10 = ftell(pFVar8);
              if (uVar10 == tzInfo->defaultTZFileSize) {
                if (tzInfo->defaultTZBuffer == (char *)0x0) {
                  rewind((FILE *)tzInfo->defaultTZFilePtr);
                  pcVar7 = (char *)uprv_malloc_63(tzInfo->defaultTZFileSize);
                  tzInfo->defaultTZBuffer = pcVar7;
                  fread(pcVar7,1,tzInfo->defaultTZFileSize,(FILE *)tzInfo->defaultTZFilePtr);
                }
                rewind(local_2c8);
                if ((long)uVar10 < 1) {
LAB_0029b61e:
                  fclose(local_2c8);
                  iVar2 = 0x14;
                  if (local_2b8.len < 0x14) {
                    iVar2 = local_2b8.len;
                  }
                  local_238[0] = local_2b8.buffer.ptr + iVar2;
                  skipZoneIDPrefix(local_238);
                  pCVar5 = gSearchTZFileResult;
                  gSearchTZFileResult->len = 0;
                  *(pCVar5->buffer).ptr = '\0';
                  icu_63::CharString::append(pCVar5,local_238[0],-1,&local_2cc);
                  pDVar4 = local_2c0;
                  if (local_2cc < U_ILLEGAL_ARGUMENT_ERROR) {
                    pcVar7 = (gSearchTZFileResult->buffer).ptr;
                  }
                  else {
                    pcVar7 = (char *)0x0;
                  }
                  goto LAB_0029b692;
                }
                while( true ) {
                  memset(local_238,0,0x200);
                  sVar11 = 0x200;
                  if (uVar10 < 0x200) {
                    sVar11 = uVar10;
                  }
                  sVar11 = fread(local_238,1,sVar11,local_2c8);
                  iVar2 = tzInfo->defaultTZPosition;
                  __n = (size_t)(int)sVar11;
                  iVar3 = bcmp(tzInfo->defaultTZBuffer + iVar2,local_238,__n);
                  if (iVar3 != 0) break;
                  tzInfo->defaultTZPosition = (int)sVar11 + iVar2;
                  uVar12 = uVar10 - __n;
                  bVar1 = (long)uVar10 < (long)__n;
                  uVar10 = uVar12;
                  if (uVar12 == 0 || bVar1) goto LAB_0029b61e;
                }
              }
            }
            fclose(local_2c8);
            pDVar4 = local_2c0;
          }
        }
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_2b8.buffer);
        goto LAB_0029b3a5;
      }
      closedir(__dirp);
      icu_63::CharString::append(&local_2b8,'/',&local_2cc);
      if (U_ZERO_ERROR < local_2cc) goto LAB_0029b692;
      pcVar7 = searchForTZFile(local_2b8.buffer.ptr,tzInfo);
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_2b8.buffer);
    } while (pcVar7 == (char *)0x0);
  }
LAB_0029b69c:
  closedir(pDVar4);
LAB_0029b6a4:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_278.buffer);
  return pcVar7;
}

Assistant:

static char* searchForTZFile(const char* path, DefaultTZInfo* tzInfo) {
    DIR* dirp = NULL;
    struct dirent* dirEntry = NULL;
    char* result = NULL;
    UErrorCode status = U_ZERO_ERROR;

    /* Save the current path */
    CharString curpath(path, -1, status);
    if (U_FAILURE(status)) {
        goto cleanupAndReturn;
    }

    dirp = opendir(path);
    if (dirp == NULL) {
        goto cleanupAndReturn;
    }

    if (gSearchTZFileResult == NULL) {
        gSearchTZFileResult = new CharString;
        if (gSearchTZFileResult == NULL) {
            goto cleanupAndReturn;
        }
        ucln_common_registerCleanup(UCLN_COMMON_PUTIL, putil_cleanup);
    }

    /* Check each entry in the directory. */
    while((dirEntry = readdir(dirp)) != NULL) {
        const char* dirName = dirEntry->d_name;
        if (uprv_strcmp(dirName, SKIP1) != 0 && uprv_strcmp(dirName, SKIP2) != 0) {
            /* Create a newpath with the new entry to test each entry in the directory. */
            CharString newpath(curpath, status);
            newpath.append(dirName, -1, status);
            if (U_FAILURE(status)) {
                break;
            }

            DIR* subDirp = NULL;
            if ((subDirp = opendir(newpath.data())) != NULL) {
                /* If this new path is a directory, make a recursive call with the newpath. */
                closedir(subDirp);
                newpath.append('/', status);
                if (U_FAILURE(status)) {
                    break;
                }
                result = searchForTZFile(newpath.data(), tzInfo);
                /*
                 Have to get out here. Otherwise, we'd keep looking
                 and return the first match in the top-level directory
                 if there's a match in the top-level. If not, this function
                 would return NULL and set gTimeZoneBufferPtr to NULL in initDefault().
                 It worked without this in most cases because we have a fallback of calling
                 localtime_r to figure out the default timezone.
                */
                if (result != NULL)
                    break;
            } else if (uprv_strcmp(TZFILE_SKIP, dirName) != 0 && uprv_strcmp(TZFILE_SKIP2, dirName) != 0) {
                if(compareBinaryFiles(TZDEFAULT, newpath.data(), tzInfo)) {
                    int32_t amountToSkip = sizeof(TZZONEINFO) - 1;
                    if (amountToSkip > newpath.length()) {
                        amountToSkip = newpath.length();
                    }
                    const char* zoneid = newpath.data() + amountToSkip;
                    skipZoneIDPrefix(&zoneid);
                    gSearchTZFileResult->clear();
                    gSearchTZFileResult->append(zoneid, -1, status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                    result = gSearchTZFileResult->data();
                    /* Get out after the first one found. */
                    break;
                }
            }
        }
    }

  cleanupAndReturn:
    if (dirp) {
        closedir(dirp);
    }
    return result;
}